

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O1

t_debug_script * __thiscall
anon_unknown.dwarf_33061f::t_debugger::f_find_module(t_debugger *this,wstring_view a_path)

{
  t_engine *ptVar1;
  int iVar2;
  t_debug_script *ptVar3;
  _Rb_tree_node_base *p_Var4;
  t_debug_script *unaff_RBP;
  size_t __n;
  int iVar5;
  size_type __rlen;
  
  __n = a_path._M_len;
  ptVar1 = this->v_engine;
  p_Var4 = (ptVar1->v_module__instances)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if ((_Rb_tree_header *)p_Var4 ==
        &(ptVar1->v_module__instances)._M_t._M_impl.super__Rb_tree_header) {
      return (t_debug_script *)0x0;
    }
    if (*(long *)(*(long *)(p_Var4 + 2) + 0x50) == 0) {
      iVar5 = 3;
      ptVar3 = unaff_RBP;
    }
    else {
      ptVar3 = (t_debug_script *)
               __dynamic_cast(*(long *)(*(long *)(p_Var4 + 2) + 0x50) + 0x48,
                              &xemmai::t_module::t_body::typeinfo,&xemmai::t_debug_script::typeinfo,
                              0);
      if (((ptVar3 == (t_debug_script *)0x0) ||
          ((ptVar3->super_t_script).v_path._M_string_length != __n)) ||
         ((iVar5 = 1, __n != 0 &&
          (iVar2 = wmemcmp(a_path._M_str,(ptVar3->super_t_script).v_path._M_dataplus._M_p,__n),
          iVar2 != 0)))) {
        iVar5 = 0;
        ptVar3 = unaff_RBP;
      }
    }
    if ((iVar5 != 3) && (iVar5 != 0)) break;
    p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
    unaff_RBP = ptVar3;
  }
  return ptVar3;
}

Assistant:

t_debug_script* f_find_module(std::wstring_view a_path)
	{
		for (auto& pair : v_engine.f_modules()) {
			auto& body = pair.second->f_as<t_module>().v_body;
			if (!body) continue;
			auto debug = dynamic_cast<t_debug_script*>(&body->f_as<t_module::t_body>());
			if (debug && debug->v_path == a_path) return debug;
		}
		return nullptr;
	}